

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

char16 * __thiscall
TTD::SlabAllocatorBase<8>::CopyRawNullTerminatedStringInto(SlabAllocatorBase<8> *this,char16 *str)

{
  size_t sizeInBytes;
  size_t sVar1;
  char16_t *dst;
  
  if (str == (char16 *)0x0) {
    dst = (char16_t *)0x0;
  }
  else {
    sVar1 = PAL_wcslen(str);
    sizeInBytes = sVar1 * 2 + 2;
    dst = SlabAllocateArray<char16_t>(this,sVar1 + 1);
    js_memcpy_s(dst,sizeInBytes,str,sizeInBytes);
  }
  return dst;
}

Assistant:

const char16* CopyRawNullTerminatedStringInto(const char16* str)
        {
            if (str == nullptr)
            {
                return nullptr;
            }
            else
            {
                size_t length = wcslen(str) + 1;
                size_t byteLength = length * sizeof(char16);

                char16* res = this->SlabAllocateArray<char16>(length);
                js_memcpy_s(res, byteLength, str, byteLength);

                return res;
            }
        }